

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

int __thiscall Parse::statementList(Parse *this)

{
  int iVar1;
  int iVar2;
  
  do {
    iVar1 = this->curIndex;
    iVar2 = statement(this);
  } while (iVar2 != 0);
  this->curIndex = iVar1;
  return 1;
}

Assistant:

int Parse::statementList() {
    int index = curIndex;
    if (statement()) {
        statementList();
        return 1;
    }
    curIndex = index;
    return 1;
}